

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O1

int Sbd_CutMergeSimple(Sbd_Man_t *p,int *pCut1,int *pCut2,int *pCut)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  long lVar8;
  
  piVar7 = pCut1 + 1;
  piVar6 = pCut2 + 1;
  lVar8 = (long)*pCut1;
  iVar4 = *pCut2;
  piVar5 = pCut + 1;
  if (0 < iVar4 && 0 < lVar8) {
    do {
      iVar2 = *piVar7;
      iVar3 = *piVar6;
      if (iVar2 == iVar3) {
        piVar7 = piVar7 + 1;
        *piVar5 = iVar2;
        piVar6 = piVar6 + 1;
      }
      else if (iVar2 < iVar3) {
        piVar7 = piVar7 + 1;
        *piVar5 = iVar2;
      }
      else {
        piVar6 = piVar6 + 1;
        *piVar5 = iVar3;
      }
      piVar5 = piVar5 + 1;
    } while ((piVar7 < pCut1 + lVar8 + 1) && (piVar6 < pCut2 + (long)iVar4 + 1));
  }
  if (piVar7 < pCut1 + lVar8 + 1) {
    piVar7 = piVar7 + -1;
    do {
      piVar1 = piVar7 + 1;
      piVar7 = piVar7 + 1;
      *piVar5 = *piVar1;
      piVar5 = piVar5 + 1;
    } while (piVar7 < pCut1 + lVar8);
  }
  if (piVar6 < pCut2 + (long)iVar4 + 1) {
    piVar6 = piVar6 + -1;
    do {
      piVar7 = piVar6 + 1;
      piVar6 = piVar6 + 1;
      *piVar5 = *piVar7;
      piVar5 = piVar5 + 1;
    } while (piVar6 < pCut2 + iVar4);
  }
  iVar4 = (int)((ulong)((long)piVar5 - (long)pCut) >> 2) + -1;
  *pCut = iVar4;
  return iVar4;
}

Assistant:

int Sbd_CutMergeSimple( Sbd_Man_t * p, int * pCut1, int * pCut2, int * pCut )
{
    int * pBeg  = pCut + 1;
    int * pBeg1 = pCut1 + 1;
    int * pBeg2 = pCut2 + 1;
    int * pEnd1 = pCut1 + 1 + pCut1[0];
    int * pEnd2 = pCut2 + 1 + pCut2[0];
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        if ( *pBeg1 == *pBeg2 )
            *pBeg++ = *pBeg1++, pBeg2++;
        else if ( *pBeg1 < *pBeg2 )
            *pBeg++ = *pBeg1++;
        else 
            *pBeg++ = *pBeg2++;
    }
    while ( pBeg1 < pEnd1 )
        *pBeg++ = *pBeg1++;
    while ( pBeg2 < pEnd2 )
        *pBeg++ = *pBeg2++;
    return (pCut[0] = pBeg - pCut - 1);
}